

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

double __thiscall
Problem_CGBG_FF::ComputeHouseProbability
          (Problem_CGBG_FF *this,Index houseI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Problem_CGBG_FF *pPVar4;
  double dVar5;
  undefined1 in_XMM3 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> oVec_hI;
  double local_38;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  pPVar4 = this;
  FilterObservationsForHouse
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,this,houseI,
             tupleOfAgents,types);
  uVar2 = this->_m_nrFireLevels;
  uVar3 = 0;
  local_38 = 0.0;
  while (uVar3 < uVar2) {
    dVar5 = Likelihood(this,(Index)pPVar4,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,(Index)uVar3
                      );
    uVar2 = this->_m_nrFireLevels;
    uVar3 = (ulong)((Index)uVar3 + 1);
    auVar1 = vcvtusi2sd_avx512f(in_XMM3,uVar2);
    local_38 = local_38 + dVar5 * (1.0 / auVar1._0_8_);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return local_38;
}

Assistant:

double Problem_CGBG_FF::ComputeHouseProbability(Index houseI,  
        const Scope& tupleOfAgents,
        const vector<Index>& types
        //const vector<Problem_CGBG_FF::observation_t>& oVec_hI
    ) const
{
#if DEBUGPROBS
    cout << "\tComputeHouseProbability for house "<<houseI
         << " tupleOfAgents=" << tupleOfAgents 
         << " types=" << PrintTools::SoftPrintVector(types)<<endl;
#endif
    vector<Problem_CGBG_FF::observation_t> oVec_hI = 
        FilterObservationsForHouse(houseI, tupleOfAgents, types);
#if DEBUGPROBS
    cout << "\tThe observation vector for this house is " << 
        PrintTools::SoftPrintVector(oVec_hI)<<endl;
#endif

    double p = 0.0;
    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        double p_oVec_fl = Likelihood(houseI, oVec_hI, fl) * Prior(houseI, fl);
#if DEBUGPROBS
        cout << "\tP(oVec, FL="<<fl<<") = " << p_oVec_fl << endl;
#endif
        p += p_oVec_fl;
    }
#if DEBUGPROBS
    cout << "P(oVec)="<< p << endl;
#endif
    return p;
}